

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TIA.cpp
# Opt level: O1

void __thiscall
Atari2600::TIA::draw_object_visible<Atari2600::TIA::Player>
          (TIA *this,Player *object,uint8_t collision_identity,int start,int end,int time_now)

{
  ulong uVar1;
  byte *pbVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  long lVar13;
  byte bVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  
  if (start < end) {
    iVar15 = (object->super_Object<Atari2600::TIA::Player>).motion_time + -0x40;
    iVar5 = time_now + 0x40;
    do {
      iVar11 = end;
      if (iVar15 < end) {
        iVar11 = iVar15;
      }
      if ((object->super_Object<Atari2600::TIA::Player>).is_moving == false) {
        iVar11 = end;
      }
      uVar16 = object->copy_flags;
      uVar12 = 0;
      if (uVar16 == 0) {
        iVar17 = 0xa0;
      }
      else {
        iVar10 = (object->super_Object<Atari2600::TIA::Player>).position;
        if (((byte)uVar16 & iVar10 < 0x10) == 0) {
          if (((byte)uVar16 >> 1 & iVar10 < 0x20) == 0) {
            iVar17 = 0xa0;
            uVar12 = 0;
            if (iVar10 < 0x40) {
              iVar17 = 0x40;
              if ((uVar16 & 4) == 0) {
                iVar17 = 0xa0;
              }
              uVar12 = (int)(uVar16 << 0x1d) >> 0x1f & 3;
            }
          }
          else {
            uVar12 = 2;
            iVar17 = 0x20;
          }
        }
        else {
          uVar12 = 1;
          iVar17 = 0x10;
        }
      }
      iVar10 = (iVar17 + start) - (object->super_Object<Atari2600::TIA::Player>).position;
      iVar17 = iVar11;
      if (iVar10 < iVar11) {
        iVar17 = iVar10;
      }
      uVar16 = iVar17 - start;
      if ((object->enqueues == true) && (time_now < iVar17)) {
        uVar6 = time_now - start;
        if (uVar6 == 0 || time_now < start) {
          iVar9 = start + 0x40;
          iVar8 = start;
        }
        else {
          uVar7 = object->pixel_position;
          if (((uVar7 != 0x20) && (object->graphic[object->graphic_index] != '\0')) &&
             (0 < (int)uVar6 && (int)uVar7 < 0x20)) {
            iVar9 = object->adder;
            uVar3 = object->reverse_mask;
            lVar13 = 200;
            do {
              bVar14 = collision_identity;
              if ((object->graphic[object->graphic_index] >> ((uVar7 >> 2 ^ uVar3) & 0x1f) & 1) == 0
                 ) {
                bVar14 = 0;
              }
              pbVar2 = (byte *)((long)&(this->crt_).time_multiplier_ + lVar13 + start);
              *pbVar2 = *pbVar2 | bVar14;
              uVar7 = uVar7 + iVar9;
            } while (((int)uVar7 < 0x20) &&
                    (uVar1 = lVar13 - 199, lVar13 = lVar13 + 1, uVar1 < uVar6));
          }
          iVar4 = object->pixel_counter;
          iVar9 = object->adder * uVar6 + object->pixel_position;
          if (0x1f < iVar9) {
            iVar9 = 0x20;
          }
          object->pixel_position = iVar9;
          object->pixel_counter = uVar6 + iVar4;
          iVar9 = iVar5;
          iVar8 = time_now;
          if (((object->copy_index_ == 0) && (iVar4 < 4)) && (3 < (int)(uVar6 + iVar4))) {
            object->latched_pixel4_time = (start - iVar4) + 0x44;
          }
        }
        Player::enqueue_pixels(object,iVar8,iVar17,iVar9);
      }
      else {
        uVar6 = object->pixel_position;
        if ((uVar6 != 0x20) &&
           ((object->graphic[object->graphic_index] != '\0' &&
            (0 < (int)uVar16 && (int)uVar6 < 0x20)))) {
          iVar9 = object->adder;
          uVar7 = object->reverse_mask;
          lVar13 = 200;
          do {
            bVar14 = collision_identity;
            if ((object->graphic[object->graphic_index] >> ((uVar6 >> 2 ^ uVar7) & 0x1f) & 1) == 0)
            {
              bVar14 = 0;
            }
            pbVar2 = (byte *)((long)&(this->crt_).time_multiplier_ + lVar13 + start);
            *pbVar2 = *pbVar2 | bVar14;
            uVar6 = uVar6 + iVar9;
          } while (((int)uVar6 < 0x20) &&
                  (uVar1 = lVar13 - 199, lVar13 = lVar13 + 1, uVar1 < uVar16));
        }
        iVar9 = object->pixel_counter;
        iVar8 = object->adder * uVar16 + object->pixel_position;
        if (0x1f < iVar8) {
          iVar8 = 0x20;
        }
        object->pixel_position = iVar8;
        object->pixel_counter = iVar9 + uVar16;
        if (((object->copy_index_ == 0) && (iVar9 < 4)) && (3 < (int)(iVar9 + uVar16))) {
          object->latched_pixel4_time = (start - iVar9) + 0x44;
        }
      }
      (object->super_Object<Atari2600::TIA::Player>).position =
           (int)(uVar16 + (object->super_Object<Atari2600::TIA::Player>).position) % 0xa0;
      if (((object->super_Object<Atari2600::TIA::Player>).is_moving == true) && (iVar17 == iVar15))
      {
        perform_motion_step<Atari2600::TIA::Player>(this,object);
        iVar15 = iVar15 + 4;
      }
      else if (iVar10 <= iVar11) {
        object->pixel_position = 0;
        object->pixel_counter = 0;
        object->copy_index_ = uVar12;
      }
      start = iVar17;
    } while (iVar17 < end);
  }
  return;
}

Assistant:

void TIA::draw_object_visible(T &object, const uint8_t collision_identity, int start, int end, int time_now) {
	// perform a miniature event loop on (i) triggering draws; (ii) drawing; and (iii) motion
	int next_motion_time = object.motion_time - first_pixel_cycle + 4;
	while(start < end) {
		int next_event_time = end;

		// is the next event a movement tick?
		if(object.is_moving && next_motion_time < next_event_time) {
			next_event_time = next_motion_time;
		}

		// is the next event a graphics trigger?
		int next_copy = 160;
		int next_copy_id = 0;
		if(object.copy_flags) {
			if(object.position < 16 && object.copy_flags&1) {
				next_copy = 16;
				next_copy_id = 1;
			} else if(object.position < 32 && object.copy_flags&2) {
				next_copy = 32;
				next_copy_id = 2;
			} else if(object.position < 64 && object.copy_flags&4) {
				next_copy = 64;
				next_copy_id = 3;
			}
		}

		int next_copy_time = start + next_copy - object.position;
		if(next_copy_time < next_event_time) next_event_time = next_copy_time;

		// the decision is to progress by length
		const int length = next_event_time - start;

		// enqueue a future intention to draw pixels if spitting them out now would violate accuracy;
		// otherwise draw them now
		if(object.enqueues && next_event_time > time_now) {
			if(start < time_now) {
				object.output_pixels(&collision_buffer_[start], time_now - start, collision_identity, start + first_pixel_cycle - 4);
				object.enqueue_pixels(time_now, next_event_time, time_now + first_pixel_cycle - 4);
			} else {
				object.enqueue_pixels(start, next_event_time, start + first_pixel_cycle - 4);
			}
		} else {
			object.output_pixels(&collision_buffer_[start], length, collision_identity, start + first_pixel_cycle - 4);
		}

		// the next interesting event is after next_event_time cycles, so progress
		object.position = (object.position + length) % 160;
		start = next_event_time;

		// if the event is a motion tick, apply; if it's a draw trigger, trigger a draw
		if(object.is_moving && start == next_motion_time) {
			perform_motion_step(object);
			next_motion_time += 4;
		} else if(start == next_copy_time) {
			object.reset_pixels(next_copy_id);
		}
	}
}